

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hh
# Opt level: O0

void __thiscall avro::InputBuffer::InputBuffer(InputBuffer *this,InputBuffer *param_2)

{
  shared_ptr<const_avro::detail::BufferImpl> *in_RSI;
  shared_ptr<const_avro::detail::BufferImpl> *in_stack_ffffffffffffffe8;
  
  boost::shared_ptr<const_avro::detail::BufferImpl>::shared_ptr(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

class AVRO_DECL InputBuffer 
{

  public:

    typedef detail::size_type size_type;
    typedef detail::data_type data_type;

    // needed for asio
    typedef detail::InputBufferIterator const_iterator;

    /** 
     * Default InputBuffer creates an empty buffer.
     *
     * Copy/assignment functions use the default ones.  They will do a shallow
     * copy, and because InputBuffer is immutable, the copies will be
     * identical.
     *
     * Destructor also uses the default, which resets a shared pointer,
     * deleting the underlying data if no other copies of exist.
     **/

    InputBuffer() :
        pimpl_(new detail::BufferImpl)
    { }

    /** 
     * Construct an InputBuffer that contains the contents of an OutputBuffer.
     * The two buffers will have the same contents, but this copy will be
     * immutable, while the the OutputBuffer may still be written to.  
     *
     * If you wish to move the data from the OutputBuffer to a new InputBuffer
     * (leaving only free space in the OutputBuffer),
     * OutputBuffer::extractData() will do this more efficiently.
     *
     * Implicit conversion is allowed.
     **/

    InputBuffer(const OutputBuffer &src) :
        pimpl_(new detail::BufferImpl(*src.pimpl_))
    { }

    /** 
     * Does the buffer have any data? 
     **/

    bool empty() const {
        return (pimpl_->size() == 0);
    }

    /** 
     * Returns the size of the buffer, in bytes. 
     **/

    size_type size() const {
        return pimpl_->size();
    }

    /**
     * Return an iterator pointing to the first data chunk of this buffer
     * that contains data.
     **/

    const_iterator begin() const {
        return const_iterator(pimpl_->beginRead());
    }

    /**
     * Return the end iterator. 
     **/

    const_iterator end() const {
        return const_iterator(pimpl_->endRead());
    }

    /** 
     * Returns the number of chunks containing data.
     **/

    int numChunks() const {
        return pimpl_->numDataChunks();
    }


  private:

    friend class OutputBuffer; // for append function
    friend class istreambuf;
    friend class BufferReader;

    explicit InputBuffer(const detail::BufferImpl::SharedPtr &pimpl) :
        pimpl_(pimpl) 
    { }

    /**
     * Class to indicate that a copy of a OutputBuffer to InputBuffer should be
     * a shallow copy, used to enable reading of the contents of an
     * OutputBuffer without need to convert it to InputBuffer using a deep
     * copy.  It is private and only used by BufferReader and istreambuf
     * classes.
     *
     * Writing to an OutputBuffer while it is being read may lead to undefined
     * behavior.
     **/

    class ShallowCopy {};

    /** 
     * Make a shallow copy of an OutputBuffer in order to read it without 
     * causing conversion overhead.
     **/
    InputBuffer(const OutputBuffer &src, const ShallowCopy &) : 
        pimpl_(src.pimpl_)
    { }

    /** 
     * Make a shallow copy of an InputBuffer.  The default copy constructor
     * already provides shallow copy, this is just provided for generic
     * algorithms that wish to treat InputBuffer and OutputBuffer in the same
     * manner.
     **/

     InputBuffer(const InputBuffer &src, const ShallowCopy &) : 
        pimpl_(src.pimpl_)
    { }


    detail::BufferImpl::ConstSharedPtr pimpl_; ///< Must never be null.
}